

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O3

void __thiscall
HttpResponse::HttpResponse(HttpResponse *this,string *responseData,URL *originalURL,Log *log)

{
  _Rb_tree_header *p_Var1;
  Log *this_00;
  pointer pcVar2;
  int iVar3;
  StringBufferHelper *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  (this->_httpStatusCode)._M_dataplus._M_p = (pointer)&(this->_httpStatusCode).field_2;
  (this->_httpStatusCode)._M_string_length = 0;
  (this->_httpStatusCode).field_2._M_local_buf[0] = '\0';
  (this->_httpStatusText)._M_dataplus._M_p = (pointer)&(this->_httpStatusText).field_2;
  (this->_httpStatusText)._M_string_length = 0;
  (this->_httpStatusText).field_2._M_local_buf[0] = '\0';
  (this->_httpVersion)._M_dataplus._M_p = (pointer)&(this->_httpVersion).field_2;
  (this->_httpVersion)._M_string_length = 0;
  (this->_httpVersion).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_headerMap)._M_t._M_impl.super__Rb_tree_header;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_headerMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->_log;
  Log::Log(this_00);
  std::__cxx11::string::_M_assign((string *)this_00);
  (this->_log)._printFunction = log->_printFunction;
  this->_requestURL = originalURL;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"HttpResponse","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Starting parsing","");
  Log::Add(this_00,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::__cxx11::string::substr((ulong)local_90,(ulong)responseData);
  iVar3 = std::__cxx11::string::compare((char *)local_90);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->_httpStatusCode,0,(char *)(this->_httpStatusCode)._M_string_length,
               0x108274);
    std::__cxx11::string::substr((ulong)local_90,(ulong)responseData);
    std::__cxx11::string::operator=((string *)&this->_httpStatusText,(string *)local_90);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0]);
    }
    paVar4 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Client handled error occured","");
    Log::Add(this_00,&local_b0);
    _Var5._M_p = local_b0._M_dataplus._M_p;
  }
  else {
    this_01 = (StringBufferHelper *)operator_new(0x28);
    pcVar2 = (responseData->_M_dataplus)._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + responseData->_M_string_length);
    StringBufferHelper::StringBufferHelper(this_01,&local_d0);
    this->_pRawBuffer = this_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    parseHttpEnvelope(this);
    parseHttpHeaders(this);
    paVar4 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"HttpResponse","");
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"Parsing of response went ok","");
    Log::Add(this_00,&local_f0,&local_110);
    _Var5._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
      _Var5._M_p = local_f0._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5._M_p != paVar4) {
    operator_delete(_Var5._M_p);
  }
  return;
}

Assistant:

HttpResponse::HttpResponse(string responseData, URL* originalURL,
                            Log log) {
  _log = log;
  _requestURL = originalURL;
  _log.Add("HttpResponse", "Starting parsing");

  if (responseData.substr(0, 5) == "ERROR") {
    _httpStatusCode = "999";
    _httpStatusText = responseData.substr(5, responseData.size()-5);
    _log.Add("Client handled error occured");
  } else {
    _pRawBuffer = new StringBufferHelper(responseData);
    parseHttpResponseData();
    _log.Add("HttpResponse", "Parsing of response went ok");
  }
}